

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

void HTS_b2mc(double *b,double *mc,int m,double a)

{
  double dVar1;
  double o;
  double d;
  double a_local;
  int m_local;
  double *mc_local;
  double *b_local;
  
  d = b[m];
  mc[m] = d;
  for (m_local = m + -1; -1 < m_local; m_local = m_local + -1) {
    dVar1 = a * d;
    d = b[m_local];
    mc[m_local] = dVar1 + b[m_local];
  }
  return;
}

Assistant:

static void HTS_b2mc(const double *b, double *mc, int m, const double a)
{
   double d, o;

   d = mc[m] = b[m];
   for (m--; m >= 0; m--) {
      o = b[m] + a * d;
      d = b[m];
      mc[m] = o;
   }
}